

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O0

int mi_reallocarr(void *p,size_t count,size_t size)

{
  int *piVar1;
  void *pvVar2;
  void *in_RDX;
  undefined8 *in_RDI;
  void *newp;
  void **op;
  size_t in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    local_4 = 0x16;
  }
  else {
    pvVar2 = mi_reallocarray(in_RDX,(size_t)in_RDI,in_stack_ffffffffffffffd0);
    if (pvVar2 == (void *)0x0) {
      piVar1 = __errno_location();
      local_4 = *piVar1;
    }
    else {
      *in_RDI = pvVar2;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

mi_decl_nodiscard int mi_reallocarr( void* p, size_t count, size_t size ) mi_attr_noexcept { // NetBSD
  mi_assert(p != NULL);
  if (p == NULL) {
    errno = EINVAL;
    return EINVAL;
  }
  void** op = (void**)p;
  void* newp = mi_reallocarray(*op, count, size);
  if mi_unlikely(newp == NULL) { return errno; }